

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

QModelIndex * __thiscall
QTableView::indexAt(QModelIndex *__return_storage_ptr__,QTableView *this,QPoint *pos)

{
  QTableViewPrivate *this_00;
  QAbstractItemModel *pQVar1;
  uint row;
  uint column;
  long in_FS_OFFSET;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTableViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  QAbstractItemViewPrivate::executePostedLayout(&this_00->super_QAbstractItemViewPrivate);
  row = rowAt(this,(pos->yp).m_i);
  column = columnAt(this,(pos->xp).m_i);
  if ((int)(column | row) < 0) {
    __return_storage_ptr__->r = -1;
    __return_storage_ptr__->c = -1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __return_storage_ptr__->i = 0;
      (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
      return __return_storage_ptr__;
    }
  }
  else {
    if ((QSpanCollection *)
        (this_00->spans).spans.
        super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
        _M_node.super__List_node_base._M_next != &this_00->spans) {
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      local_58.m.ptr._0_1_ = true;
      local_58.m.ptr._1_3_ = 0xaaaaaa;
      QTableViewPrivate::span((Span *)&local_58,this_00,row,column);
      row = local_58.r;
      column = local_58.c;
    }
    pQVar1 = (this_00->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              (&local_58,&(this_00->super_QAbstractItemViewPrivate).root);
    (**(code **)(*(long *)pQVar1 + 0x60))(__return_storage_ptr__,pQVar1,row,column,&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QTableView::indexAt(const QPoint &pos) const
{
    Q_D(const QTableView);
    d->executePostedLayout();
    int r = rowAt(pos.y());
    int c = columnAt(pos.x());
    if (r >= 0 && c >= 0) {
        if (d->hasSpans()) {
            QSpanCollection::Span span = d->span(r, c);
            r = span.top();
            c = span.left();
        }
        return d->model->index(r, c, d->root);
    }
    return QModelIndex();
}